

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_fast.c
# Opt level: O0

uint32_t lzma_crc32(uint8_t *buf,size_t size,uint32_t crc)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint32_t tmp;
  uint8_t *limit;
  size_t sStack_18;
  uint32_t crc_local;
  size_t size_local;
  uint8_t *buf_local;
  
  limit._4_4_ = crc ^ 0xffffffff;
  sStack_18 = size;
  size_local = (size_t)buf;
  if (8 < size) {
    for (; (size_local & 7) != 0; size_local = size_local + 1) {
      limit._4_4_ = lzma_crc32_table[0][(uint)*(byte *)size_local ^ limit._4_4_ & 0xff] ^
                    limit._4_4_ >> 8;
      sStack_18 = sStack_18 - 1;
    }
    uVar3 = size_local + (sStack_18 & 0xfffffffffffffff8);
    sStack_18 = sStack_18 & 7;
    for (; size_local < uVar3; size_local = size_local + 8) {
      uVar2 = *(uint *)size_local ^ limit._4_4_;
      uVar1 = *(uint *)(size_local + 4);
      limit._4_4_ = lzma_crc32_table[3][uVar1 & 0xff] ^ lzma_crc32_table[2][uVar1 >> 8 & 0xff] ^
                    lzma_crc32_table[7][uVar2 & 0xff] ^ lzma_crc32_table[6][uVar2 >> 8 & 0xff] ^
                    lzma_crc32_table[5][uVar2 >> 0x10 & 0xff] ^ lzma_crc32_table[4][uVar2 >> 0x18] ^
                    lzma_crc32_table[1][uVar1 >> 0x10 & 0xff] ^ lzma_crc32_table[0][uVar1 >> 0x18];
    }
  }
  while (sStack_18 != 0) {
    limit._4_4_ = lzma_crc32_table[0][(uint)*(byte *)size_local ^ limit._4_4_ & 0xff] ^
                  limit._4_4_ >> 8;
    sStack_18 = sStack_18 - 1;
    size_local = size_local + 1;
  }
  return limit._4_4_ ^ 0xffffffff;
}

Assistant:

extern LZMA_API(uint32_t)
lzma_crc32(const uint8_t *buf, size_t size, uint32_t crc)
{
	crc = ~crc;

#ifdef WORDS_BIGENDIAN
	crc = bswap32(crc);
#endif

	if (size > 8) {
		// Fix the alignment, if needed. The if statement above
		// ensures that this won't read past the end of buf[].
		while ((uintptr_t)(buf) & 7) {
			crc = lzma_crc32_table[0][*buf++ ^ A(crc)] ^ S8(crc);
			--size;
		}

		// Calculate the position where to stop.
		const uint8_t *const limit = buf + (size & ~(size_t)(7));

		// Calculate how many bytes must be calculated separately
		// before returning the result.
		size &= (size_t)(7);

		// Calculate the CRC32 using the slice-by-eight algorithm.
		while (buf < limit) {
			crc ^= *(const uint32_t *)(buf);
			buf += 4;

			crc = lzma_crc32_table[7][A(crc)]
			    ^ lzma_crc32_table[6][B(crc)]
			    ^ lzma_crc32_table[5][C(crc)]
			    ^ lzma_crc32_table[4][D(crc)];

			const uint32_t tmp = *(const uint32_t *)(buf);
			buf += 4;

			// At least with some compilers, it is critical for
			// performance, that the crc variable is XORed
			// between the two table-lookup pairs.
			crc = lzma_crc32_table[3][A(tmp)]
			    ^ lzma_crc32_table[2][B(tmp)]
			    ^ crc
			    ^ lzma_crc32_table[1][C(tmp)]
			    ^ lzma_crc32_table[0][D(tmp)];
		}
	}

	while (size-- != 0)
		crc = lzma_crc32_table[0][*buf++ ^ A(crc)] ^ S8(crc);

#ifdef WORDS_BIGENDIAN
	crc = bswap32(crc);
#endif

	return ~crc;
}